

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_CreateBlockMap(void)

{
  long *__s;
  long lVar1;
  long lVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  void *__s_00;
  int *piVar8;
  int iVar9;
  size_t size;
  ulong uVar10;
  uint ii;
  int iVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  size_t __n;
  TArray<int,_int> *pTVar16;
  TArray<int,_int> *this;
  size_t i;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  size_t j;
  ulong uVar22;
  uint uVar23;
  TArray<int,_int> *this_00;
  int iVar24;
  int iVar25;
  double dVar26;
  int iVar28;
  DVector2 DVar27;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  double dVar33;
  double dVar34;
  int local_40e4;
  uint local_40e0;
  uint local_40dc;
  ulong local_40d8;
  int local_40d0;
  int adder;
  undefined8 local_40c8;
  undefined8 uStack_40c0;
  TArray<int,_int> BlockMap;
  int local_4060;
  int zero;
  long local_4058;
  long local_4050;
  long local_4048;
  long local_4040;
  int buckets [4096];
  
  if (0 < (long)numvertexes) {
    DVar27 = vertexes->p;
    lVar13 = 0;
    uVar29 = DVar27.X._0_4_;
    uVar31 = DVar27.X._4_4_;
    uVar30 = DVar27.Y._0_4_;
    uVar32 = DVar27.Y._4_4_;
    while( true ) {
      dVar34 = DVar27.X;
      dVar26 = DVar27.Y;
      if ((long)numvertexes * 0x38 + -0x38 == lVar13) break;
      dVar3 = *(double *)((long)&vertexes[1].p.X + lVar13);
      dVar33 = dVar3;
      if (((double)CONCAT44(uVar31,uVar29) < dVar3 || (double)CONCAT44(uVar31,uVar29) == dVar3) &&
         (dVar33 = (double)CONCAT44(uVar31,uVar29), dVar34 < dVar3)) {
        dVar34 = dVar3;
      }
      dVar3 = *(double *)((long)&vertexes[1].p.Y + lVar13);
      if ((double)CONCAT44(uVar32,uVar30) < dVar3 || (double)CONCAT44(uVar32,uVar30) == dVar3) {
        if (dVar26 < dVar3) {
          dVar26 = dVar3;
        }
      }
      else {
        uVar30 = SUB84(dVar3,0);
        uVar32 = (undefined4)((ulong)dVar3 >> 0x20);
      }
      lVar13 = lVar13 + 0x38;
      DVar27.Y = dVar26;
      DVar27.X = dVar34;
      uVar29 = SUB84(dVar33,0);
      uVar31 = (undefined4)((ulong)dVar33 >> 0x20);
    }
    local_40c8 = CONCAT44((int)(double)CONCAT44(uVar32,uVar30),(int)(double)CONCAT44(uVar31,uVar29))
    ;
    uStack_40c0 = 0;
    iVar25 = ((int)dVar34 - (int)(double)CONCAT44(uVar31,uVar29) >> 7) + 1;
    iVar28 = ((int)dVar26 - (int)(double)CONCAT44(uVar32,uVar30) >> 7) + 1;
    local_40d8 = (ulong)(uint)(iVar25 * iVar28);
    TArray<int,_int>::TArray(&BlockMap,iVar25 * iVar28 * 3 + 4);
    adder = (int)local_40c8;
    TArray<int,_int>::Push(&BlockMap,&adder);
    iVar4 = local_40c8._4_4_;
    adder = local_40c8._4_4_;
    TArray<int,_int>::Push(&BlockMap,&adder);
    adder = iVar25;
    TArray<int,_int>::Push(&BlockMap,&adder);
    adder = iVar28;
    TArray<int,_int>::Push(&BlockMap,&adder);
    iVar5 = (int)local_40d8;
    __n = (long)iVar5 * 0x10;
    uVar10 = __n + 8;
    if (iVar5 < 0) {
      uVar10 = 0xffffffffffffffff;
    }
    plVar7 = (long *)operator_new__(uVar10);
    *plVar7 = (long)iVar5;
    __s = plVar7 + 1;
    if ((int)local_40d8 != 0) {
      memset(__s,0,__n);
    }
    iVar5 = (int)local_40c8;
    local_4048 = (long)iVar25;
    local_4040 = local_4048 << 4;
    local_40d0 = iVar25;
    for (local_40e4 = 0; local_40e4 < numlines; local_40e4 = local_40e4 + 1) {
      iVar9 = (int)((lines[local_40e4].v1)->p).X;
      iVar6 = (int)((lines[local_40e4].v1)->p).Y;
      iVar20 = (int)((lines[local_40e4].v2)->p).X;
      iVar19 = (int)((lines[local_40e4].v2)->p).Y;
      local_40e0 = iVar9 - iVar5;
      uVar21 = (int)local_40e0 >> 7;
      uVar10 = (ulong)uVar21;
      uVar18 = iVar6 - iVar4;
      iVar24 = (int)uVar18 >> 7;
      local_40dc = iVar20 - iVar5 >> 7;
      iVar15 = iVar19 - iVar4 >> 7;
      iVar11 = iVar24 * iVar25 + uVar21;
      this = (TArray<int,_int> *)(__s + (long)iVar11 * 2);
      iVar12 = iVar15 * iVar25 + local_40dc;
      local_40c8 = uVar10;
      if (iVar11 == iVar12) {
        TArray<int,_int>::Push(this,&local_40e4);
      }
      else {
        this_00 = (TArray<int,_int> *)(__s + (long)iVar12 * 2);
        if (iVar24 == iVar15) {
          pTVar16 = this;
          if ((int)local_40dc < (int)uVar21) {
            pTVar16 = this_00;
            this_00 = this;
          }
          do {
            TArray<int,_int>::Push(pTVar16,&local_40e4);
            pTVar16 = pTVar16 + 1;
          } while (pTVar16 <= this_00);
        }
        else if (uVar21 == local_40dc) {
          pTVar16 = this;
          if (iVar15 < iVar24) {
            pTVar16 = this_00;
            this_00 = this;
          }
          do {
            TArray<int,_int>::Push(pTVar16,&local_40e4);
            pTVar16 = (TArray<int,_int> *)((long)&pTVar16->Array + local_4040);
          } while (pTVar16 <= this_00);
        }
        else {
          iVar20 = iVar20 - iVar9;
          iVar19 = iVar19 - iVar6;
          iVar25 = -iVar20;
          if (0 < iVar20) {
            iVar25 = iVar20;
          }
          iVar6 = -iVar19;
          if (0 < iVar19) {
            iVar6 = iVar19;
          }
          if (iVar25 == iVar6) {
            uVar21 = 0x80 - (local_40e0 & 0x7f);
            if (-1 < iVar20) {
              uVar21 = local_40e0 & 0x7f;
            }
            uVar23 = 0x80 - (uVar18 & 0x7f);
            if (-1 < iVar19) {
              uVar23 = uVar18 & 0x7f;
            }
            iVar25 = iVar25 - (uint)(uVar21 < uVar23);
          }
          local_4050 = (long)iVar20;
          uVar23 = iVar20 >> 0x1f | 1;
          local_4058 = (long)iVar19;
          uVar21 = iVar19 >> 0x1f | 1;
          iVar9 = uVar21 * local_40d0;
          lVar13 = (long)(int)uVar23;
          if (iVar25 < iVar6) {
            local_40e0 = (iVar20 >> 0x1f | 0x80U) - local_40e0;
            do {
              iVar6 = (int)((int)(((int)((int)uVar10 * 0x80 + local_40e0) * local_4058) / local_4050
                                 ) + uVar18) >> 7;
              pTVar16 = this + lVar13;
              local_40c8 = uVar10;
              for (; iVar6 != iVar24; iVar24 = iVar24 + uVar21) {
                TArray<int,_int>::Push(this,&local_40e4);
                this = this + iVar9;
                pTVar16 = pTVar16 + iVar9;
              }
              TArray<int,_int>::Push(this,&local_40e4);
              iVar25 = local_40d0;
              this = this + lVar13;
              uVar10 = local_40c8 + lVar13;
              iVar24 = iVar6;
            } while (local_40dc != (uint)uVar10);
            for (; pTVar16 != this_00; pTVar16 = pTVar16 + iVar9) {
              TArray<int,_int>::Push(pTVar16,&local_40e4);
            }
            TArray<int,_int>::Push(this_00,&local_40e4);
          }
          else {
            local_40dc = (iVar19 >> 0x1f | 0x80U) - uVar18;
            do {
              uVar10 = local_40c8 & 0xffffffff;
              local_40c8 = (ulong)(uint)((int)((int)(((int)(iVar24 * 0x80 + local_40dc) * local_4050
                                                     ) / local_4058) + local_40e0) >> 7);
              pTVar16 = this + iVar9;
              while( true ) {
                if ((int)local_40c8 == (int)uVar10) break;
                TArray<int,_int>::Push(this,&local_40e4);
                uVar10 = (ulong)((int)uVar10 + uVar23);
                this = this + lVar13;
                pTVar16 = pTVar16 + lVar13;
              }
              TArray<int,_int>::Push(this,&local_40e4);
              iVar25 = local_40d0;
              this = this + iVar9;
              iVar24 = iVar24 + uVar21;
            } while (iVar15 != iVar24);
            for (; pTVar16 != this_00; pTVar16 = pTVar16 + lVar13) {
              TArray<int,_int>::Push(pTVar16,&local_40e4);
            }
            TArray<int,_int>::Push(this_00,&local_40e4);
          }
        }
      }
    }
    TArray<int,_int>::Reserve(&BlockMap,(uint)local_40d8);
    zero = 0;
    local_4060 = -1;
    uVar10 = (local_40d8 & 0xffffffff) << 2;
    if ((int)local_40d8 < 0) {
      uVar10 = 0xffffffffffffffff;
    }
    __s_00 = operator_new__(uVar10);
    memset(__s_00,0xff,iVar28 * local_4048 * 4);
    memset(buckets,0xff,0x4000);
    uVar10 = 0;
    iVar25 = (int)local_40d8;
    local_40d8 = local_40d8 & 0xffffffff;
    if (iVar25 < 1) {
      local_40d8 = uVar10;
    }
    for (; uVar10 != local_40d8; uVar10 = uVar10 + 1) {
      uVar18 = *(uint *)((long)plVar7 + uVar10 * 0x10 + 0x14);
      uVar22 = (ulong)uVar18;
      uVar21 = 0;
      for (uVar17 = 0; uVar22 != uVar17; uVar17 = uVar17 + 1) {
        uVar21 = uVar21 * 0x2fcb + *(int *)(__s[uVar10 * 2] + uVar17 * 4);
      }
      piVar14 = buckets + (uVar21 & 0xfff);
      piVar8 = piVar14;
      while (lVar13 = (long)*piVar8, lVar13 != -1) {
        if (uVar18 == *(uint *)((long)plVar7 + lVar13 * 0x10 + 0x14)) {
          if (uVar22 == 0) {
LAB_004d221e:
            BlockMap.Array[uVar10 + 4] = BlockMap.Array[lVar13 + 4];
            goto LAB_004d222c;
          }
          uVar17 = 0;
          do {
            if (uVar22 == uVar17) goto LAB_004d221e;
            lVar1 = uVar17 * 4;
            lVar2 = uVar17 * 4;
            uVar17 = uVar17 + 1;
          } while (*(int *)(__s[uVar10 * 2] + lVar1) == *(int *)(__s[lVar13 * 2] + lVar2));
        }
        piVar8 = (int *)((long)__s_00 + lVar13 * 4);
      }
      *(int *)((long)__s_00 + uVar10 * 4) = *piVar14;
      *piVar14 = (int)uVar10;
      BlockMap.Array[uVar10 + 4] = BlockMap.Count;
      TArray<int,_int>::Push(&BlockMap,&zero);
      piVar8 = (int *)__s[uVar10 * 2];
      for (uVar22 = 0; uVar22 < *(uint *)((long)(__s + uVar10 * 2) + 0xc); uVar22 = uVar22 + 1) {
        TArray<int,_int>::Push(&BlockMap,piVar8);
        piVar8 = piVar8 + 1;
      }
      TArray<int,_int>::Push(&BlockMap,&local_4060);
LAB_004d222c:
    }
    operator_delete__(__s_00);
    lVar13 = *plVar7 * 0x10;
    uVar10 = lVar13 + 8;
    lVar1 = *plVar7;
    while (lVar1 != 0) {
      TArray<int,_int>::~TArray((TArray<int,_int> *)((long)plVar7 + lVar13 + -8));
      lVar13 = lVar13 + -0x10;
      lVar1 = lVar13;
    }
    operator_delete__(plVar7,uVar10);
    piVar8 = (int *)operator_new__((ulong)BlockMap.Count * 4);
    blockmaplump = piVar8;
    for (uVar10 = 0; BlockMap.Count != uVar10; uVar10 = uVar10 + 1) {
      piVar8[uVar10] = BlockMap.Array[uVar10];
    }
    TArray<int,_int>::~TArray(&BlockMap);
  }
  return;
}

Assistant:

static void P_CreateBlockMap ()
{
	TArray<int> *BlockLists, *block, *endblock;
	int adder;
	int bmapwidth, bmapheight;
	double dminx, dmaxx, dminy, dmaxy;
	int minx, maxx, miny, maxy;
	int i;
	int line;

	if (numvertexes <= 0)
		return;

	// Find map extents for the blockmap
	dminx = dmaxx = vertexes[0].fX();
	dminy = dmaxy = vertexes[0].fY();

	for (i = 1; i < numvertexes; ++i)
	{
			 if (vertexes[i].fX() < dminx) dminx = vertexes[i].fX();
		else if (vertexes[i].fX() > dmaxx) dmaxx = vertexes[i].fX();
			 if (vertexes[i].fY() < dminy) dminy = vertexes[i].fY();
		else if (vertexes[i].fY() > dmaxy) dmaxy = vertexes[i].fY();
	}

	minx = int(dminx);
	miny = int(dminy);
	maxx = int(dmaxx);
	maxy = int(dmaxy);

	bmapwidth =	 ((maxx - minx) >> BLOCKBITS) + 1;
	bmapheight = ((maxy - miny) >> BLOCKBITS) + 1;

	TArray<int> BlockMap (bmapwidth * bmapheight * 3 + 4);

	adder = minx;			BlockMap.Push (adder);
	adder = miny;			BlockMap.Push (adder);
	adder = bmapwidth;		BlockMap.Push (adder);
	adder = bmapheight;		BlockMap.Push (adder);

	BlockLists = new TArray<int>[bmapwidth * bmapheight];

	for (line = 0; line < numlines; ++line)
	{
		int x1 = int(lines[line].v1->fX());
		int y1 = int(lines[line].v1->fY());
		int x2 = int(lines[line].v2->fX());
		int y2 = int(lines[line].v2->fY());
		int dx = x2 - x1;
		int dy = y2 - y1;
		int bx = (x1 - minx) >> BLOCKBITS;
		int by = (y1 - miny) >> BLOCKBITS;
		int bx2 = (x2 - minx) >> BLOCKBITS;
		int by2 = (y2 - miny) >> BLOCKBITS;

		block = &BlockLists[bx + by * bmapwidth];
		endblock = &BlockLists[bx2 + by2 * bmapwidth];

		if (block == endblock)	// Single block
		{
			block->Push (line);
		}
		else if (by == by2)		// Horizontal line
		{
			if (bx > bx2)
			{
				swapvalues (block, endblock);
			}
			do
			{
				block->Push (line);
				block += 1;
			} while (block <= endblock);
		}
		else if (bx == bx2)	// Vertical line
		{
			if (by > by2)
			{
				swapvalues (block, endblock);
			}
			do
			{
				block->Push (line);
				block += bmapwidth;
			} while (block <= endblock);
		}
		else				// Diagonal line
		{
			int xchange = (dx < 0) ? -1 : 1;
			int ychange = (dy < 0) ? -1 : 1;
			int ymove = ychange * bmapwidth;
			int adx = abs (dx);
			int ady = abs (dy);

			if (adx == ady)		// 45 degrees
			{
				int xb = (x1 - minx) & (BLOCKSIZE-1);
				int yb = (y1 - miny) & (BLOCKSIZE-1);
				if (dx < 0)
				{
					xb = BLOCKSIZE-xb;
				}
				if (dy < 0)
				{
					yb = BLOCKSIZE-yb;
				}
				if (xb < yb)
					adx--;
			}
			if (adx >= ady)		// X-major
			{
				int yadd = dy < 0 ? -1 : BLOCKSIZE;
				do
				{
					int stop = (Scale ((by << BLOCKBITS) + yadd - (y1 - miny), dx, dy) + (x1 - minx)) >> BLOCKBITS;
					while (bx != stop)
					{
						block->Push (line);
						block += xchange;
						bx += xchange;
					}
					block->Push (line);
					block += ymove;
					by += ychange;
				} while (by != by2);
				while (block != endblock)
				{
					block->Push (line);
					block += xchange;
				}
				block->Push (line);
			}
			else					// Y-major
			{
				int xadd = dx < 0 ? -1 : BLOCKSIZE;
				do
				{
					int stop = (Scale ((bx << BLOCKBITS) + xadd - (x1 - minx), dy, dx) + (y1 - miny)) >> BLOCKBITS;
					while (by != stop)
					{
						block->Push (line);
						block += ymove;
						by += ychange;
					}
					block->Push (line);
					block += xchange;
					bx += xchange;
				} while (bx != bx2);
				while (block != endblock)
				{
					block->Push (line);
					block += ymove;
				}
				block->Push (line);
			}
		}
	}

	BlockMap.Reserve (bmapwidth * bmapheight);
	CreatePackedBlockmap (BlockMap, BlockLists, bmapwidth, bmapheight);
	delete[] BlockLists;

	blockmaplump = new int[BlockMap.Size()];
	for (unsigned int ii = 0; ii < BlockMap.Size(); ++ii)
	{
		blockmaplump[ii] = BlockMap[ii];
	}
}